

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::get(ParmParse *this,char *name,long *ptr,int ival)

{
  Table *in_RSI;
  long *in_RDI;
  string *name_00;
  allocator local_61;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  ParmParse *in_stack_ffffffffffffffc0;
  
  name_00 = (string *)in_RDI[10];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,(char *)in_RSI,&local_61);
  prefixedName(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  anon_unknown_12::anon_unknown_0::sgetval<long>(in_RSI,name_00,in_RDI,0,0xf0a070);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void
ParmParse::get (const char* name,
                long&       ptr,
                int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival, LAST);
}